

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  curl_trc_feat *pcVar4;
  ulong uVar5;
  int iVar6;
  CURLcode CVar7;
  Curl_hash *pCVar8;
  size_t sVar9;
  Curl_addrinfo *pCVar10;
  void *pvVar11;
  Curl_dns_entry *dns;
  char *pcVar12;
  curl_slist **ppcVar13;
  Curl_addrinfo *pCVar14;
  size_t in_R8;
  Curl_addrinfo *pCVar15;
  curl_off_t port;
  Curl_str source;
  char *host;
  Curl_hash *local_2a8;
  Curl_addrinfo *local_2a0;
  char *local_298;
  curl_slist **local_290;
  char address [64];
  curl_off_t num;
  ulong local_240;
  char entry_id [262];
  
  pCVar8 = &dnscache_get(data)->entries;
  if (pCVar8 == (Curl_hash *)0x0) {
    CVar7 = CURLE_FAILED_INIT;
  }
  else {
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 & 0xfb;
    ppcVar13 = &(data->state).resolve;
    local_290 = ppcVar13;
    while (pcVar3 = *ppcVar13, pcVar3 != (curl_slist *)0x0) {
      host = pcVar3->data;
      if (host != (char *)0x0) {
        if (*host == '-') {
          num = 0;
          host = host + 1;
          iVar6 = Curl_str_single(&host,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&host,&source,0x2e,']');
            if (iVar6 != 0) goto LAB_00130eb6;
            iVar6 = Curl_str_single(&host,']');
          }
          else {
            iVar6 = Curl_str_until(&host,&source,0x1000,':');
          }
          if (((iVar6 == 0) && (iVar6 = Curl_str_single(&host,':'), iVar6 == 0)) &&
             (iVar6 = Curl_str_number(&host,&num,0xffff), iVar6 == 0)) {
            sVar9 = create_dnscache_id(source.str,CONCAT44(source.len._4_4_,(uint)source.len),
                                       (int)num,entry_id,in_R8);
            dnscache_lock(data,(Curl_dnscache *)pCVar8);
            Curl_hash_delete(pCVar8,entry_id,sVar9 + 1);
            dnscache_unlock(data,(Curl_dnscache *)pCVar8);
          }
        }
        else {
          port = 0;
          cVar2 = *host;
          if (cVar2 == '+') {
            host = host + 1;
          }
          iVar6 = Curl_str_single(&host,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&host,&source,0x2e,']');
            if (iVar6 != 0) goto LAB_00130eb6;
            iVar6 = Curl_str_single(&host,']');
          }
          else {
            iVar6 = Curl_str_until(&host,&source,0x1000,':');
          }
          if (iVar6 == 0) {
            iVar6 = Curl_str_single(&host,':');
            if (((iVar6 != 0) || (iVar6 = Curl_str_number(&host,&port,0xffff), iVar6 != 0)) ||
               (iVar6 = Curl_str_single(&host,':'), iVar6 != 0)) {
LAB_00130f50:
              pCVar15 = (Curl_addrinfo *)0x0;
LAB_00130f1f:
              Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
              Curl_freeaddrinfo(pCVar15);
              return CURLE_SETOPT_OPTION_SYNTAX;
            }
            local_298 = host;
            local_2a0 = (Curl_addrinfo *)0x0;
            pCVar14 = (Curl_addrinfo *)0x0;
            local_2a8 = pCVar8;
            pCVar15 = local_2a0;
LAB_00130b74:
            do {
              local_2a0 = pCVar15;
              pCVar15 = local_2a0;
              if (*host == '\0') break;
              iVar6 = Curl_str_single(&host,'[');
              if (iVar6 == 0) {
                iVar6 = Curl_str_until(&host,(Curl_str *)&num,0x2e,']');
                pCVar15 = local_2a0;
                if ((iVar6 != 0) ||
                   (iVar6 = Curl_str_single(&host,']'), pCVar15 = local_2a0, iVar6 != 0))
                goto LAB_00130f1f;
              }
              else {
                iVar6 = Curl_str_until(&host,(Curl_str *)&num,0x1000,',');
                if (iVar6 != 0) {
                  iVar6 = Curl_str_single(&host,',');
                  pCVar15 = local_2a0;
                  if (iVar6 != 0) goto LAB_00130f1f;
                  goto LAB_00130b74;
                }
              }
              uVar5 = local_240;
              pCVar15 = local_2a0;
              if (0x3f < local_240) goto LAB_00130f1f;
              memcpy(address,(void *)num,local_240);
              address[uVar5] = '\0';
              pCVar10 = Curl_str2addr(address,(int)port);
              if (pCVar10 == (Curl_addrinfo *)0x0) {
                pCVar15 = local_2a0;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                   ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar4->log_level)))) {
                  Curl_infof(data,"Resolve address \'%s\' found illegal",address);
                  pCVar15 = local_2a0;
                }
                goto LAB_00130f1f;
              }
              pCVar15 = pCVar10;
              if (pCVar14 != (Curl_addrinfo *)0x0) {
                pCVar14->ai_next = pCVar10;
                pCVar15 = local_2a0;
              }
              iVar6 = Curl_str_single(&host,',');
              pCVar14 = pCVar10;
            } while (iVar6 == 0);
            if (pCVar15 == (Curl_addrinfo *)0x0) goto LAB_00130f50;
            sVar9 = create_dnscache_id(source.str,CONCAT44(source.len._4_4_,(uint)source.len),
                                       (int)port,entry_id,in_R8);
            pCVar8 = local_2a8;
            dnscache_lock(data,(Curl_dnscache *)local_2a8);
            pvVar11 = Curl_hash_pick(pCVar8,entry_id,sVar9 + 1);
            if (pvVar11 != (void *)0x0) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",(ulong)(uint)source.len
                           ,source.str,port);
              }
              Curl_hash_delete(local_2a8,entry_id,sVar9 + 1);
            }
            pcVar12 = source.str;
            sVar9 = CONCAT44(source.len._4_4_,(uint)source.len);
            iVar6 = (int)port;
            in_R8 = port & 0xffffffff;
            dns = Curl_dnscache_mk_entry(data,pCVar15,source.str,sVar9,(int)port,cVar2 != '+');
            if (dns == (Curl_dns_entry *)0x0) {
LAB_00130f5d:
              dnscache_unlock(data,(Curl_dnscache *)local_2a8);
              return CURLE_OUT_OF_MEMORY;
            }
            sVar9 = create_dnscache_id(pcVar12,sVar9,iVar6,(char *)&num,in_R8);
            pCVar8 = local_2a8;
            pvVar11 = Curl_hash_add(local_2a8,&num,sVar9 + 1,dns);
            if (pvVar11 == (void *)0x0) {
              dnscache_entry_free(dns);
              goto LAB_00130f5d;
            }
            *(long *)((long)pvVar11 + 0x10) = *(long *)((long)pvVar11 + 0x10) + 1;
            *(long *)((long)pvVar11 + 0x10) = *(long *)((long)pvVar11 + 0x10) + -1;
            dnscache_unlock(data,(Curl_dnscache *)pCVar8);
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar12 = " (non-permanent)";
              if (cVar2 != '+') {
                pcVar12 = "";
              }
              in_R8 = port;
              Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)source.len,source.str,
                         port,local_298,pcVar12);
            }
            iVar6 = Curl_str_casecompare(&source,"*");
            if (iVar6 != 0) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE *:%ld using wildcard",port);
              }
              puVar1 = &(data->state).field_0x7c0;
              *puVar1 = *puVar1 | 4;
            }
          }
        }
      }
LAB_00130eb6:
      ppcVar13 = &pcVar3->next;
    }
    *local_290 = (curl_slist *)0x0;
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}